

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cpp
# Opt level: O2

int main(void)

{
  UnitTest test;
  UnitTest local_9;
  
  unittest::UnitTest::TestParseGenerate1(&local_9);
  unittest::UnitTest::TestParseGenerate1W(&local_9);
  unittest::UnitTest::TestParseGenerate2(&local_9);
  unittest::UnitTest::TestParseGenerate2W(&local_9);
  unittest::UnitTest::TestParseGenerate3(&local_9);
  unittest::UnitTest::TestParseGenerate4(&local_9);
  unittest::UnitTest::TestInfiniteRecursion1(&local_9);
  unittest::UnitTest::TestInfiniteRecursion2(&local_9);
  unittest::UnitTest::TestInfiniteRecursion3(&local_9);
  unittest::UnitTest::TestInterpolate1(&local_9);
  unittest::UnitTest::TestExtract(&local_9);
  unittest::UnitTest::TestDefault(&local_9);
  unittest::UnitTest::TestHashComment1(&local_9);
  unittest::UnitTest::TestHashComment2(&local_9);
  unittest::UnitTest::TestMixedComment(&local_9);
  unittest::UnitTest::TestGetValue(&local_9);
  unittest::UnitTest::TestTrailingComments(&local_9);
  return 0;
}

Assistant:

int main() {
	unittest::UnitTest test;
	test.TestParseGenerate1();
	test.TestParseGenerate1W();
	test.TestParseGenerate2();
	test.TestParseGenerate2W();
	test.TestParseGenerate3();
	test.TestParseGenerate4();
	test.TestInfiniteRecursion1();
	test.TestInfiniteRecursion2();
	test.TestInfiniteRecursion3();
	test.TestInterpolate1();
	test.TestExtract();
	test.TestDefault();
	test.TestHashComment1();
	test.TestHashComment2();
	test.TestMixedComment();
	test.TestGetValue();
	test.TestTrailingComments();
	return 0;
}